

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_04.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  istream *this;
  ostream *poVar2;
  int iVar3;
  int number2;
  int number1;
  undefined8 local_18;
  
  local_18 = in_RAX;
  std::operator<<((ostream *)&std::cout,"Enter two integers to compare: ");
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_18 + 4));
  std::istream::operator>>(this,(int *)&local_18);
  if (local_18._4_4_ == (int)local_18) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_18);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar3 = (int)local_18;
  if (local_18._4_4_ != (int)local_18) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_18);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (local_18._4_4_ < (int)local_18) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
      poVar2 = std::operator<<(poVar2," < ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_18);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    iVar3 = local_18._4_4_;
    iVar1 = (int)local_18;
    if ((int)local_18 < local_18._4_4_) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
      poVar2 = std::operator<<(poVar2," > ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_18);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = local_18._4_4_;
      iVar1 = (int)local_18;
    }
    if (iVar1 < iVar3) goto LAB_0010131f;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  poVar2 = std::operator<<(poVar2," <= ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_18);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = local_18._4_4_;
  iVar1 = (int)local_18;
LAB_0010131f:
  if (iVar1 <= iVar3) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    poVar2 = std::operator<<(poVar2," >= ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_18);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    int number1;
    int number2;

    std::cout << "Enter two integers to compare: ";  // prompt user for data
    std::cin >> number1 >> number2;  // read two integers from user

    if (number1 == number2)
        std::cout << number1 << " == " << number2 << std::endl;

    if (number1 != number2)
        std::cout << number1 << " != " << number2 << std::endl;

    if (number1 < number2)
        std::cout << number1 << " < " << number2 << std::endl;

    if (number1 > number2)
        std::cout << number1 << " > " << number2 << std::endl;

    if (number1 <= number2)
        std::cout << number1 << " <= " << number2 << std::endl;

    if (number1 >= number2)
        std::cout << number1 << " >= " << number2 << std::endl;

    return 0;
}